

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::IntegerStateQueryVerifiers::GetIntegerVerifier::verifyStencilMaskInitial
          (GetIntegerVerifier *this,TestContext *testCtx,GLenum name,int stencilBits)

{
  int pname;
  bool bVar1;
  qpTestResult qVar2;
  int *data;
  uint *puVar3;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  MessageBuilder local_1b0;
  uint local_30;
  undefined1 local_2c [4];
  GLint reference;
  StateQueryMemoryWriteGuard<int> state;
  int stencilBits_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetIntegerVerifier *this_local;
  
  state.m_value = stencilBits;
  state.m_postguard = name;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_2c);
  pname = state.m_postguard;
  data = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                   ((StateQueryMemoryWriteGuard<int> *)local_2c);
  glu::CallLogWrapper::glGetIntegerv(&(this->super_StateVerifier).super_CallLogWrapper,pname,data);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)local_2c,testCtx);
  if (bVar1) {
    local_30 = (1 << ((byte)state.m_value & 0x1f)) - 1;
    puVar3 = (uint *)deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                               ((StateQueryMemoryWriteGuard *)local_2c);
    if ((*puVar3 & local_30) != local_30) {
      this_00 = tcu::TestContext::getLog(testCtx);
      tcu::TestLog::operator<<(&local_1b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_1b0,(char (*) [36])"// ERROR: expected minimum mask of ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)&local_30);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [7])0x2b8b5f6);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(StateQueryMemoryWriteGuard<int> *)local_2c);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b0);
      qVar2 = tcu::TestContext::getTestResult(testCtx);
      if (qVar2 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid mask value");
      }
    }
  }
  return;
}

Assistant:

void GetIntegerVerifier::verifyStencilMaskInitial (tcu::TestContext& testCtx, GLenum name, int stencilBits)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint> state;
	glGetIntegerv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	const GLint reference = (1 << stencilBits) - 1;

	if ((state & reference) != reference) // the least significant stencilBits bits should be on
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected minimum mask of " << reference << "; got " << state << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid mask value");
	}
}